

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::ValidateExtensionDeclaration(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>const&,google::protobuf::DescriptorProto_ExtensionRange_const&,absl::lts_20250127::flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  Nonnull<char_*> pcVar1;
  size_t in_R9;
  string_view format;
  long local_58;
  Nonnull<char_*> local_50;
  long local_48;
  Nonnull<char_*> local_40;
  char local_38 [32];
  
  pcVar1 = numbers_internal::FastIntToBuffer(*(int32_t *)(*(long *)this + 0x28),local_38);
  local_58 = (long)pcVar1 - (long)local_38;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  format._M_str = (char *)&local_58;
  format._M_len = (size_t)"Extension declaration number $0 is not in the extension range.";
  local_50 = local_38;
  local_48 = local_58;
  local_40 = local_38;
  substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0x3e,format,
             (Nullable<const_absl::string_view_*>)0x1,in_R9);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}